

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

void __thiscall
ear::PolarPointSourcePanner::PolarPointSourcePanner
          (PolarPointSourcePanner *this,
          vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
          *regions,optional<int> numberOfChannels)

{
  pointer puVar1;
  int iVar2;
  internal_error *this_00;
  string local_48;
  
  (this->super_PointSourcePanner)._vptr_PointSourcePanner = (_func_int **)&PTR_handle_0019a7d8;
  puVar1 = (regions->
           super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->_regions).
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (regions->
       super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->_regions).
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->_regions).
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (regions->
       super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (regions->
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (regions->
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (regions->
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((ulong)numberOfChannels.super_type & 1) == 0) {
    iVar2 = _numberOfRequiredChannels(this);
    this->_numberOfOutputChannels = iVar2;
  }
  else {
    this->_numberOfOutputChannels = numberOfChannels.super_type.m_storage;
    iVar2 = _numberOfRequiredChannels(this);
    if (numberOfChannels.super_type.m_storage < iVar2) {
      this_00 = (internal_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"not enough output channels in PolarPointSourcePanner","");
      internal_error::internal_error(this_00,&local_48);
      __cxa_throw(this_00,&internal_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

PolarPointSourcePanner::PolarPointSourcePanner(
      std::vector<std::unique_ptr<RegionHandler>> regions,
      boost::optional<int> numberOfChannels)
      : _regions(std::move(regions)) {
    if (!numberOfChannels) {
      _numberOfOutputChannels = _numberOfRequiredChannels();
    } else {
      _numberOfOutputChannels = numberOfChannels.get();
      ear_assert(_numberOfOutputChannels >= _numberOfRequiredChannels(),
                 "not enough output channels in PolarPointSourcePanner");
    }
  }